

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

int FFSdecode_in_place(FFSContext iocontext,char *src,void **dest_ptr)

{
  int iVar1;
  FFSTypeHandle_conflict ioformat;
  char *dest;
  
  ioformat = FFSTypeHandle_from_encode(iocontext,src);
  if (ioformat == (FFSTypeHandle_conflict)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = check_conversion(ioformat);
    if (iVar1 == 0) {
      dest = (char *)0x0;
      iVar1 = 0;
    }
    else {
      iVar1 = FFSheader_size(ioformat);
      dest = src + iVar1;
      iVar1 = FFSinternal_decode(ioformat,src,dest,1);
    }
    *dest_ptr = dest;
  }
  return iVar1;
}

Assistant:

extern int
FFSdecode_in_place(FFSContext iocontext, char *src, void **dest_ptr)
{
    FFSTypeHandle ioformat = FFSTypeHandle_from_encode(iocontext, src);
    int header_size;
    int ret;

    if (ioformat == NULL) {
	return 0;
    }
    if (!check_conversion(ioformat)) {
	*dest_ptr = NULL;
	return 0;
    }
    header_size = FFSheader_size(ioformat);
    ret = FFSinternal_decode(ioformat, src, src + header_size, 1);
    *dest_ptr = src + header_size;
    return ret;
}